

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall cnn::Model::project_weights(Model *this,float radius)

{
  float *pfVar1;
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  long *plVar6;
  bool bVar7;
  ulong uVar8;
  ostream *poVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  double dVar18;
  undefined1 auVar19 [64];
  undefined1 in_XMM5 [16];
  
  if (project_weights::project_scratch == (float *)0x0) {
    project_weights::project_scratch =
         (float *)cnn_mm_malloc(*(long *)(this + 8) - *(long *)this >> 1,0x100);
  }
  lVar4 = *(long *)this;
  lVar5 = *(long *)(this + 8);
  if (lVar4 == lVar5) {
    dVar18 = 0.0;
  }
  else {
    lVar12 = 0;
    lVar13 = 0;
    iVar11 = 0;
    do {
      plVar6 = *(long **)(lVar4 + lVar13 * 2);
      (**(code **)(*plVar6 + 8))(plVar6,(long)project_weights::project_scratch + lVar13);
      lVar2 = lVar4 + 8 + lVar12;
      iVar11 = iVar11 + -1;
      lVar13 = lVar13 + 4;
      lVar12 = lVar12 + 8;
    } while (lVar2 != lVar5);
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar16 = vpbroadcastq_avx512f();
    uVar10 = 0;
    auVar17 = ZEXT864(0);
    do {
      auVar19 = auVar17;
      auVar17 = vpbroadcastq_avx512f();
      auVar17 = vporq_avx512f(auVar17,auVar15);
      uVar8 = vpcmpuq_avx512f(auVar17,auVar16,2);
      pfVar1 = project_weights::project_scratch + uVar10;
      auVar14._4_4_ = (uint)((byte)(uVar8 >> 1) & 1) * (int)pfVar1[1];
      auVar14._0_4_ = (uint)((byte)uVar8 & 1) * (int)*pfVar1;
      auVar14._8_4_ = (uint)((byte)(uVar8 >> 2) & 1) * (int)pfVar1[2];
      auVar14._12_4_ = (uint)((byte)(uVar8 >> 3) & 1) * (int)pfVar1[3];
      auVar14._16_4_ = (uint)((byte)(uVar8 >> 4) & 1) * (int)pfVar1[4];
      auVar14._20_4_ = (uint)((byte)(uVar8 >> 5) & 1) * (int)pfVar1[5];
      auVar14._24_4_ = (uint)((byte)(uVar8 >> 6) & 1) * (int)pfVar1[6];
      auVar14._28_4_ = (uint)(byte)(uVar8 >> 7) * (int)pfVar1[7];
      uVar10 = uVar10 + 8;
      auVar17 = vcvtps2pd_avx512f(auVar14);
      auVar17 = vaddpd_avx512f(auVar19,auVar17);
    } while (((ulong)(uint)-iVar11 + 7 & 0xfffffffffffffff8) != uVar10);
    bVar7 = (bool)((byte)uVar8 & 1);
    auVar15._0_8_ = (ulong)bVar7 * auVar17._0_8_ | (ulong)!bVar7 * auVar19._0_8_;
    bVar7 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar15._8_8_ = (ulong)bVar7 * auVar17._8_8_ | (ulong)!bVar7 * auVar19._8_8_;
    bVar7 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar15._16_8_ = (ulong)bVar7 * auVar17._16_8_ | (ulong)!bVar7 * auVar19._16_8_;
    bVar7 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar15._24_8_ = (ulong)bVar7 * auVar17._24_8_ | (ulong)!bVar7 * auVar19._24_8_;
    bVar7 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar15._32_8_ = (ulong)bVar7 * auVar17._32_8_ | (ulong)!bVar7 * auVar19._32_8_;
    bVar7 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar15._40_8_ = (ulong)bVar7 * auVar17._40_8_ | (ulong)!bVar7 * auVar19._40_8_;
    bVar7 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar15._48_8_ = (ulong)bVar7 * auVar17._48_8_ | (ulong)!bVar7 * auVar19._48_8_;
    auVar15._56_8_ = (uVar8 >> 7) * auVar17._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar19._56_8_;
    auVar14 = vextractf64x4_avx512f(auVar15,1);
    auVar17 = vaddpd_avx512f(auVar15,ZEXT3264(auVar14));
    dVar18 = auVar17._0_8_ + auVar17._16_8_ + auVar17._8_8_ + auVar17._24_8_;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"NORM: ",6);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar18;
  auVar3 = vsqrtsd_avx(in_XMM5,auVar3);
  poVar9 = std::ostream::_M_insert<double>(auVar3._0_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  return;
}

Assistant:

void Model::project_weights(float radius) {
  static float* project_scratch = 0;
  if (!project_scratch)
    project_scratch = (float*)cnn_mm_malloc(all_params.size() * sizeof(float), 256);
  int pi = 0;
  for (auto p : all_params) {
    p->squared_l2norm(&project_scratch[pi]);
    ++pi;
  }
  double gg = 0;
  for (int i = 0; i < pi; ++i)
    gg += project_scratch[i];
  cerr << "NORM: " << sqrt(gg) << endl;
}